

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_adj.cpp
# Opt level: O2

Read<signed_char> __thiscall
Omega_h::get_codes_to_canonical<long>(Omega_h *this,Int deg,Read<int> *ev2v)

{
  void *extraout_RDX;
  Write<int> *this_00;
  Read<signed_char> RVar1;
  ScopedTimer omega_h_scoped_function_timer;
  allocator local_d1;
  Write<int> local_d0;
  Write<int> local_c0;
  Write<int> local_b0;
  string local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  std::__cxx11::string::string
            ((string *)&local_80,
             "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_adj.cpp"
             ,&local_d1);
  std::operator+(&local_60,&local_80,":");
  std::__cxx11::to_string(&local_a0,99);
  std::operator+(&local_40,&local_60,&local_a0);
  begin_code("get_codes_to_canonical",local_40._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_80);
  if (deg == 2) {
    this_00 = &local_d0;
    Write<long>::Write(this_00,&ev2v->write_);
    get_codes_to_canonical_deg<2,long>(this,(Read<int> *)this_00);
  }
  else if (deg == 3) {
    this_00 = &local_c0;
    Write<long>::Write(this_00,&ev2v->write_);
    get_codes_to_canonical_deg<3,long>(this,(Read<int> *)this_00);
  }
  else {
    if (deg != 4) {
      fail("assertion %s failed at %s +%d\n","false",
           "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_adj.cpp"
           ,0x67);
    }
    this_00 = &local_b0;
    Write<long>::Write(this_00,&ev2v->write_);
    get_codes_to_canonical_deg<4,long>(this,(Read<int> *)this_00);
  }
  Write<long>::~Write((Write<long> *)this_00);
  ScopedTimer::~ScopedTimer(&omega_h_scoped_function_timer);
  RVar1.write_.shared_alloc_.direct_ptr = extraout_RDX;
  RVar1.write_.shared_alloc_.alloc = (Alloc *)this;
  return (Read<signed_char>)RVar1.write_.shared_alloc_;
}

Assistant:

Read<I8> get_codes_to_canonical(Int const deg, Read<T> const ev2v) {
  OMEGA_H_TIME_FUNCTION;
  if (deg == 4) return get_codes_to_canonical_deg<4>(ev2v);
  if (deg == 3) return get_codes_to_canonical_deg<3>(ev2v);
  if (deg == 2) return get_codes_to_canonical_deg<2>(ev2v);
  OMEGA_H_NORETURN(Read<I8>());
}